

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::cmExportInstallFileGenerator
          (cmExportInstallFileGenerator *this,cmInstallExportGenerator *iegen)

{
  _Rb_tree_header *p_Var1;
  
  cmExportFileGenerator::cmExportFileGenerator(&this->super_cmExportFileGenerator);
  (this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator =
       (_func_int **)&PTR__cmExportInstallFileGenerator_00674c18;
  this->IEGen = iegen;
  p_Var1 = &(this->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ConfigImportFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

cmExportInstallFileGenerator
::cmExportInstallFileGenerator(cmInstallExportGenerator* iegen):
  IEGen(iegen)
{
}